

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_computeOffset
               (CF2_GlyphPath glyphpath,CF2_F16Dot16 x1,CF2_F16Dot16 y1,CF2_F16Dot16 x2,
               CF2_F16Dot16 y2,CF2_F16Dot16 *x,CF2_F16Dot16 *y)

{
  int iVar1;
  FT_Fast FVar2;
  FT_Int32 FVar3;
  int local_30;
  int local_2c;
  CF2_F16Dot16 dy;
  CF2_F16Dot16 dx;
  CF2_F16Dot16 *x_local;
  CF2_F16Dot16 y2_local;
  CF2_F16Dot16 x2_local;
  CF2_F16Dot16 y1_local;
  CF2_F16Dot16 x1_local;
  CF2_GlyphPath glyphpath_local;
  
  local_2c = x2 - x1;
  local_30 = y2 - y1;
  if (glyphpath->font->reverseWinding != '\0') {
    local_2c = -local_2c;
    local_30 = -local_30;
  }
  *y = 0;
  *x = 0;
  if (glyphpath->darken != '\0') {
    iVar1 = glyphpath->callbacks->windingMomentum;
    FVar2 = cf2_getWindingMomentum(x1,y1,x2,y2);
    glyphpath->callbacks->windingMomentum = iVar1 + FVar2;
    if (local_2c < 0) {
      if (local_30 < 0) {
        iVar1 = -local_2c;
        if (iVar1 == local_30 * -2 || SBORROW4(iVar1,local_30 * -2) != iVar1 + local_30 * 2 < 0) {
          local_30 = -local_30;
          if (local_30 == local_2c * -2 ||
              SBORROW4(local_30,local_2c * -2) != local_30 + local_2c * 2 < 0) {
            FVar3 = FT_MulFix_x86_64(-0xb332,glyphpath->xOffset);
            *x = FVar3;
            FVar3 = FT_MulFix_x86_64(0x1b333,glyphpath->yOffset);
            *y = FVar3;
          }
          else {
            *x = -glyphpath->xOffset;
            *y = glyphpath->yOffset;
          }
        }
        else {
          *x = 0;
          *y = glyphpath->yOffset << 1;
        }
      }
      else {
        iVar1 = -local_2c;
        if (iVar1 == local_30 * 2 || SBORROW4(iVar1,local_30 * 2) != iVar1 + local_30 * -2 < 0) {
          if (local_30 == local_2c * -2 ||
              SBORROW4(local_30,local_2c * -2) != local_30 + local_2c * 2 < 0) {
            FVar3 = FT_MulFix_x86_64(0xb333,glyphpath->xOffset);
            *x = FVar3;
            FVar3 = FT_MulFix_x86_64(0x1b333,glyphpath->yOffset);
            *y = FVar3;
          }
          else {
            *x = glyphpath->xOffset;
            *y = glyphpath->yOffset;
          }
        }
        else {
          *x = 0;
          *y = glyphpath->yOffset << 1;
        }
      }
    }
    else if (local_30 < 0) {
      if (local_2c == local_30 * -2 ||
          SBORROW4(local_2c,local_30 * -2) != local_2c + local_30 * 2 < 0) {
        local_30 = -local_30;
        if (local_30 == local_2c * 2 ||
            SBORROW4(local_30,local_2c * 2) != local_30 + local_2c * -2 < 0) {
          FVar3 = FT_MulFix_x86_64(-0xb332,glyphpath->xOffset);
          *x = FVar3;
          FVar3 = FT_MulFix_x86_64(0x4ccd,glyphpath->yOffset);
          *y = FVar3;
        }
        else {
          *x = -glyphpath->xOffset;
          *y = glyphpath->yOffset;
        }
      }
      else {
        *x = 0;
        *y = 0;
      }
    }
    else if (local_2c == local_30 * 2 ||
             SBORROW4(local_2c,local_30 * 2) != local_2c + local_30 * -2 < 0) {
      if (local_30 == local_2c * 2 ||
          SBORROW4(local_30,local_2c * 2) != local_30 + local_2c * -2 < 0) {
        FVar3 = FT_MulFix_x86_64(0xb333,glyphpath->xOffset);
        *x = FVar3;
        FVar3 = FT_MulFix_x86_64(0x4ccd,glyphpath->yOffset);
        *y = FVar3;
      }
      else {
        *x = glyphpath->xOffset;
        *y = glyphpath->yOffset;
      }
    }
    else {
      *x = 0;
      *y = 0;
    }
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_computeOffset( CF2_GlyphPath  glyphpath,
                               CF2_Fixed      x1,
                               CF2_Fixed      y1,
                               CF2_Fixed      x2,
                               CF2_Fixed      y2,
                               CF2_Fixed*     x,
                               CF2_Fixed*     y )
  {
    CF2_Fixed  dx = SUB_INT32( x2, x1 );
    CF2_Fixed  dy = SUB_INT32( y2, y1 );


    /* note: negative offsets don't work here; negate deltas to change */
    /* quadrants, below                                                */
    if ( glyphpath->font->reverseWinding )
    {
      dx = NEG_INT32( dx );
      dy = NEG_INT32( dy );
    }

    *x = *y = 0;

    if ( !glyphpath->darken )
        return;

    /* add momentum for this path element */
    glyphpath->callbacks->windingMomentum =
      ADD_INT32( glyphpath->callbacks->windingMomentum,
                 cf2_getWindingMomentum( x1, y1, x2, y2 ) );

    /* note: allow mixed integer and fixed multiplication here */
    if ( dx >= 0 )
    {
      if ( dy >= 0 )
      {
        /* first quadrant, +x +y */

        if ( dx > MUL_INT32( 2, dy ) )
        {
          /* +x */
          *x = 0;
          *y = 0;
        }
        else if ( dy > MUL_INT32( 2, dx ) )
        {
          /* +y */
          *x = glyphpath->xOffset;
          *y = glyphpath->yOffset;
        }
        else
        {
          /* +x +y */
          *x = FT_MulFix( cf2_doubleToFixed( 0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 - 0.7 ),
                          glyphpath->yOffset );
        }
      }
      else
      {
        /* fourth quadrant, +x -y */

        if ( dx > MUL_INT32( -2, dy ) )
        {
          /* +x */
          *x = 0;
          *y = 0;
        }
        else if ( NEG_INT32( dy ) > MUL_INT32( 2, dx ) )
        {
          /* -y */
          *x = NEG_INT32( glyphpath->xOffset );
          *y = glyphpath->yOffset;
        }
        else
        {
          /* +x -y */
          *x = FT_MulFix( cf2_doubleToFixed( -0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 - 0.7 ),
                          glyphpath->yOffset );
        }
      }
    }
    else
    {
      if ( dy >= 0 )
      {
        /* second quadrant, -x +y */

        if ( NEG_INT32( dx ) > MUL_INT32( 2, dy ) )
        {
          /* -x */
          *x = 0;
          *y = MUL_INT32( 2, glyphpath->yOffset );
        }
        else if ( dy > MUL_INT32( -2, dx ) )
        {
          /* +y */
          *x = glyphpath->xOffset;
          *y = glyphpath->yOffset;
        }
        else
        {
          /* -x +y */
          *x = FT_MulFix( cf2_doubleToFixed( 0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 + 0.7 ),
                          glyphpath->yOffset );
        }
      }
      else
      {
        /* third quadrant, -x -y */

        if ( NEG_INT32( dx ) > MUL_INT32( -2, dy ) )
        {
          /* -x */
          *x = 0;
          *y = MUL_INT32( 2, glyphpath->yOffset );
        }
        else if ( NEG_INT32( dy ) > MUL_INT32( -2, dx ) )
        {
          /* -y */
          *x = NEG_INT32( glyphpath->xOffset );
          *y = glyphpath->yOffset;
        }
        else
        {
          /* -x -y */
          *x = FT_MulFix( cf2_doubleToFixed( -0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 + 0.7 ),
                          glyphpath->yOffset );
        }
      }
    }
  }